

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O2

void __thiscall riffcpp::Chunk::iterator::iterator(iterator *this,iter *it)

{
  impl *piVar1;
  __mbstate_t _Var2;
  impl *this_00;
  
  this_00 = (impl *)operator_new(0x30);
  (this_00->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_00->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->m_pos)._M_off = 0;
  (this_00->m_pos)._M_state.__count = 0;
  (this_00->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (this_00->m_limit)._M_off = 0;
  (this_00->m_limit)._M_state.__count = 0;
  (this_00->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  std::__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>::
  operator=((__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             *)this_00,
            (__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             *)it->pimpl);
  piVar1 = it->pimpl;
  _Var2 = (piVar1->m_pos)._M_state;
  (this_00->m_pos)._M_off = (piVar1->m_pos)._M_off;
  (this_00->m_pos)._M_state = _Var2;
  _Var2 = (piVar1->m_limit)._M_state;
  (this_00->m_limit)._M_off = (piVar1->m_limit)._M_off;
  (this_00->m_limit)._M_state = _Var2;
  this->pimpl = this_00;
  return;
}

Assistant:

riffcpp::Chunk::iterator::iterator(const iter &it) {
  auto im = new riffcpp::Chunk::iterator::impl();
  im->m_stream = it.pimpl->m_stream;
  im->m_pos = it.pimpl->m_pos;
  im->m_limit = it.pimpl->m_limit;

  pimpl = im;
}